

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  KeyInfo *pKeyInfo_00;
  KeyInfo *pKeyInfo;
  UnpackedRecord *pIdxKey;
  int rc;
  int *pRes_local;
  int bias_local;
  i64 nKey_local;
  void *pKey_local;
  BtCursor *pCur_local;
  
  if (pKey == (void *)0x0) {
    pKeyInfo = (KeyInfo *)0x0;
  }
  else {
    pKeyInfo_00 = pCur->pKeyInfo;
    pKeyInfo = (KeyInfo *)sqlite3VdbeAllocUnpackedRecord(pKeyInfo_00);
    if (pKeyInfo == (KeyInfo *)0x0) {
      return 7;
    }
    sqlite3VdbeRecordUnpack(pKeyInfo_00,(int)nKey,pKey,(UnpackedRecord *)pKeyInfo);
    if ((*(u16 *)&pKeyInfo->db == 0) || (pKeyInfo_00->nAllField < *(ushort *)&pKeyInfo->db)) {
      pIdxKey._4_4_ = sqlite3CorruptError(0xfa01);
      goto LAB_001830ad;
    }
  }
  pIdxKey._4_4_ = sqlite3BtreeMovetoUnpacked(pCur,(UnpackedRecord *)pKeyInfo,nKey,bias,pRes);
LAB_001830ad:
  if (pKeyInfo != (KeyInfo *)0x0) {
    sqlite3DbFree(pCur->pKeyInfo->db,pKeyInfo);
  }
  return pIdxKey._4_4_;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    KeyInfo *pKeyInfo = pCur->pKeyInfo;
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 || pIdxKey->nField>pKeyInfo->nAllField ){
      rc = SQLITE_CORRUPT_BKPT;
      goto moveto_done;
    }
  }else{
    pIdxKey = 0;
  }
  rc = sqlite3BtreeMovetoUnpacked(pCur, pIdxKey, nKey, bias, pRes);
moveto_done:
  if( pIdxKey ){
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }
  return rc;
}